

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestParseObject(void)

{
  FILE *pFVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *pmVar2;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> pBVar3;
  bool bVar4;
  ValueTypes VVar5;
  int iVar6;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> *ppBVar7;
  __tuple_element_t<0UL,_tuple<ParseResults,_BubbleValue_*>_> *p_Var8;
  size_t sVar9;
  BubbleValue *pBVar10;
  char *pcVar11;
  pointer ppVar12;
  double dVar13;
  double dVar14;
  __cxx11 local_188 [32];
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
  local_168;
  __cxx11 local_160 [32];
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
  local_140;
  _Self local_138;
  __cxx11 local_130 [32];
  _Self local_110;
  int local_104;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *pmStack_100;
  int i_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *objects;
  BubbleValue *valueLevel2;
  undefined1 local_e8 [4];
  int i_2;
  __cxx11 local_d8 [32];
  __cxx11 local_b8 [32];
  __cxx11 local_98 [48];
  __cxx11 local_68 [32];
  int local_48;
  int local_44;
  int i_1;
  int i;
  BubbleJson local_30;
  __tuple_element_t<1UL,_tuple<ParseResults,_BubbleValue_*>_> local_20;
  BubbleValue *value;
  tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> result;
  
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::tuple<true,_true>
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  bubbleJson::BubbleJson::Parse(&local_30,(char *)&gm_BubbleJson);
  pcVar11 = (char *)&local_30;
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)pcVar11);
  ppBVar7 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar7;
  g_TestCount = g_TestCount + 1;
  p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var8 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    pcVar11 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x182,0,(ulong)*p_Var8);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar5 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar5 = bubbleJson::BubbleValue::GetType(local_20);
    pcVar11 = "%s:%d: expect: %d actual: %d\n";
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x183,6,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
  pFVar1 = _stderr;
  if (sVar9 == 0) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
    pcVar11 = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x184,0,sVar9);
    g_Result = 1;
  }
  pBVar3 = local_20;
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar3,pcVar11);
  }
  bubbleJson::BubbleJson::Parse((BubbleJson *)&i_1,(char *)&gm_BubbleJson);
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)&i_1);
  ppBVar7 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar7;
  g_TestCount = g_TestCount + 1;
  p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var8 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x194,0,(ulong)*p_Var8);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar5 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar5 = bubbleJson::BubbleValue::GetType(local_20);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x195,6,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
  pFVar1 = _stderr;
  if (sVar9 == 7) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x196,7,sVar9);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"n");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x198,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"n");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"n");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x199,0,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"f");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x19a,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"f");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_False) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"f");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x19b,1,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"t");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x19c,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"t");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_True) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"t");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x19d,2,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"i");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x19f,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"i");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Number) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"i");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a0,3,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"i");
  dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar10);
  pFVar1 = _stderr;
  if ((dVar13 != 123.0) || (NAN(dVar13))) {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"i");
    dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",0x405ec00000000000,dVar13,
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a1);
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a3,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_String) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a4,4,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
  sVar9 = bubbleJson::BubbleValue::GetStringLength(pBVar10);
  if (sVar9 == 3) {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
    pcVar11 = bubbleJson::BubbleValue::GetString(pBVar10);
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
    sVar9 = bubbleJson::BubbleValue::GetStringLength(pBVar10);
    iVar6 = memcmp("abc",pcVar11,sVar9);
    if (iVar6 != 0) goto LAB_00118775;
    g_TestPass = g_TestPass + 1;
  }
  else {
LAB_00118775:
    pFVar1 = _stderr;
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"s");
    pcVar11 = bubbleJson::BubbleValue::GetString(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a5,"abc",pcVar11);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a7,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a8,5,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
  sVar9 = bubbleJson::BubbleValue::GetArrayCount(pBVar10);
  pFVar1 = _stderr;
  if (sVar9 == 3) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
    sVar9 = bubbleJson::BubbleValue::GetArrayCount(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1a9,3,sVar9);
    g_Result = 1;
  }
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    g_TestCount = g_TestCount + 1;
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
    pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,local_44);
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    pFVar1 = _stderr;
    if (VVar5 == ValueType_Number) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
      pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,local_44);
      VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1ac,3,(ulong)VVar5);
      g_Result = 1;
    }
    g_TestCount = g_TestCount + 1;
    dVar13 = (double)local_44;
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
    pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,local_44);
    dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar10);
    pFVar1 = _stderr;
    if ((dVar13 + 1.0 != dVar14) || (NAN(dVar13 + 1.0) || NAN(dVar14))) {
      dVar13 = (double)local_44;
      pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"a");
      pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,local_44);
      dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar10);
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",dVar13 + 1.0,dVar14,
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1ad);
      g_Result = 1;
    }
    else {
      g_TestPass = g_TestPass + 1;
    }
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1b0,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1b1,6,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pcVar11 = "o";
  pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
  sVar9 = bubbleJson::BubbleValue::GetObjectCount(pBVar10);
  pFVar1 = _stderr;
  if (sVar9 == 3) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
    sVar9 = bubbleJson::BubbleValue::GetObjectCount(pBVar10);
    pcVar11 = "%s:%d: expect: %zu actual: %zu\n";
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1b2,3,sVar9);
    g_Result = 1;
  }
  for (local_48 = 0; pBVar3 = local_20, local_48 < 3; local_48 = local_48 + 1) {
    g_TestCount = g_TestCount + 1;
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
    std::__cxx11::to_string(local_68,local_48 + 1);
    pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,(string *)local_68);
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    std::__cxx11::string::~string((string *)local_68);
    pFVar1 = _stderr;
    if (VVar5 == ValueType_Number) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
      std::__cxx11::to_string(local_98,local_48 + 1);
      pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,(string *)local_98);
      VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1b5,3,(ulong)VVar5);
      std::__cxx11::string::~string((string *)local_98);
      g_Result = 1;
    }
    g_TestCount = g_TestCount + 1;
    dVar13 = (double)local_48;
    pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
    pcVar11 = (char *)local_b8;
    std::__cxx11::to_string((__cxx11 *)pcVar11,local_48 + 1);
    pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,(string *)pcVar11);
    dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar10);
    std::__cxx11::string::~string((string *)local_b8);
    pFVar1 = _stderr;
    if ((dVar13 + 1.0 != dVar14) || (NAN(dVar13 + 1.0) || NAN(dVar14))) {
      dVar13 = (double)local_48;
      pBVar10 = bubbleJson::BubbleValue::operator[](local_20,"o");
      std::__cxx11::to_string(local_d8,local_48 + 1);
      pBVar10 = bubbleJson::BubbleValue::operator[](pBVar10,(string *)local_d8);
      dVar14 = bubbleJson::BubbleValue::GetNumber(pBVar10);
      pcVar11 = "%s:%d: expect: %.17g actual: %.17g\n";
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",dVar13 + 1.0,dVar14,
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1b6);
      std::__cxx11::string::~string((string *)local_d8);
      g_Result = 1;
    }
    else {
      g_TestPass = g_TestPass + 1;
    }
  }
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar3,pcVar11);
  }
  bubbleJson::BubbleJson::Parse((BubbleJson *)local_e8,(char *)&gm_BubbleJson);
  std::tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*>::operator=
            ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value,(type)local_e8);
  ppBVar7 = std::get<1ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                      ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  local_20 = *ppBVar7;
  g_TestCount = g_TestCount + 1;
  p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                     ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
  pFVar1 = _stderr;
  if (*p_Var8 == ParseResult_Ok) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    p_Var8 = std::get<0ul,bubbleJson::ParseResults,bubbleJson::BubbleValue*>
                       ((tuple<bubbleJson::ParseResults,_bubbleJson::BubbleValue_*> *)&value);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1c8,0,(ulong)*p_Var8);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  VVar5 = bubbleJson::BubbleValue::GetType(local_20);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    VVar5 = bubbleJson::BubbleValue::GetType(local_20);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1c9,6,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
  pFVar1 = _stderr;
  if (sVar9 == 7) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    sVar9 = bubbleJson::BubbleValue::GetObjectCount(local_20);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1ca,7,sVar9);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"n");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1cc,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"n");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Null) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"n");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1cd,0,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"f");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1ce,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"f");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_False) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"f");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1cf,1,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"t");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d0,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"t");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_True) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"t");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d1,2,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"i");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d3,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"i");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Number) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"i");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d4,3,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"i");
  dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar10);
  pFVar1 = _stderr;
  if ((dVar13 != 123.0) || (NAN(dVar13))) {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"i");
    dVar13 = bubbleJson::BubbleValue::GetNumber(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",0x405ec00000000000,dVar13,
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d5);
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d7,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_String) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1d8,4,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
  sVar9 = bubbleJson::BubbleValue::GetStringLength(pBVar10);
  if (sVar9 == 3) {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
    pcVar11 = bubbleJson::BubbleValue::GetString(pBVar10);
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
    sVar9 = bubbleJson::BubbleValue::GetStringLength(pBVar10);
    iVar6 = memcmp("abc",pcVar11,sVar9);
    if (iVar6 == 0) {
      g_TestPass = g_TestPass + 1;
      goto LAB_00119a01;
    }
  }
  pFVar1 = _stderr;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"s");
  pcVar11 = bubbleJson::BubbleValue::GetString(pBVar10);
  fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",0x1d9,
          "abc",pcVar11);
  g_Result = 1;
LAB_00119a01:
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1db,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Array) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1dc,5,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
  sVar9 = bubbleJson::BubbleValue::GetArrayCount(pBVar10);
  pFVar1 = _stderr;
  if (sVar9 == 3) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
    sVar9 = bubbleJson::BubbleValue::GetArrayCount(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1dd,3,sVar9);
    g_Result = 1;
  }
  for (valueLevel2._4_4_ = 0; valueLevel2._4_4_ < 3; valueLevel2._4_4_ = valueLevel2._4_4_ + 1) {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"a");
    objects = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
               *)bubbleJson::BubbleValue::GetArrayElement(pBVar10,(long)valueLevel2._4_4_);
    g_TestCount = g_TestCount + 1;
    VVar5 = bubbleJson::BubbleValue::GetType((BubbleValue *)objects);
    pFVar1 = _stderr;
    if (VVar5 == ValueType_Number) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      VVar5 = bubbleJson::BubbleValue::GetType((BubbleValue *)objects);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1e1,3,(ulong)VVar5);
      g_Result = 1;
    }
    g_TestCount = g_TestCount + 1;
    dVar13 = (double)valueLevel2._4_4_;
    dVar14 = bubbleJson::BubbleValue::GetNumber((BubbleValue *)objects);
    pFVar1 = _stderr;
    if ((dVar13 + 1.0 != dVar14) || (NAN(dVar13 + 1.0) || NAN(dVar14))) {
      dVar13 = (double)valueLevel2._4_4_;
      dVar14 = bubbleJson::BubbleValue::GetNumber((BubbleValue *)objects);
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",dVar13 + 1.0,dVar14,
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1e2);
      g_Result = 1;
    }
    else {
      g_TestPass = g_TestPass + 1;
    }
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
  if (pBVar10 == (BubbleValue *)0x0) {
    fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1e5,"true","false");
    g_Result = 1;
  }
  else {
    g_TestPass = g_TestPass + 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
  VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
  pFVar1 = _stderr;
  if (VVar5 == ValueType_Object) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
    VVar5 = bubbleJson::BubbleValue::GetType(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1e6,6,(ulong)VVar5);
    g_Result = 1;
  }
  g_TestCount = g_TestCount + 1;
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
  sVar9 = bubbleJson::BubbleValue::GetObjectCount(pBVar10);
  pFVar1 = _stderr;
  if (sVar9 == 3) {
    g_TestPass = g_TestPass + 1;
  }
  else {
    pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
    sVar9 = bubbleJson::BubbleValue::GetObjectCount(pBVar10);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
            0x1e7,3,sVar9);
    g_Result = 1;
  }
  pcVar11 = "o";
  pBVar10 = bubbleJson::BubbleValue::GetObjectValueWithKey(local_20,"o");
  pmStack_100 = bubbleJson::BubbleValue::GetObjects_abi_cxx11_(pBVar10);
  for (local_104 = 0; pBVar3 = local_20, pmVar2 = pmStack_100, local_104 < 3;
      local_104 = local_104 + 1) {
    g_TestCount = g_TestCount + 1;
    std::__cxx11::to_string(local_130,local_104 + 1);
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
         ::find(pmVar2,(key_type *)local_130);
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
         ::end(pmStack_100);
    bVar4 = std::operator!=(&local_110,&local_138);
    std::__cxx11::string::~string((string *)local_130);
    if (bVar4) {
      g_TestPass = g_TestPass + 1;
    }
    else {
      fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1eb,"true","false");
      g_Result = 1;
    }
    pmVar2 = pmStack_100;
    g_TestCount = g_TestCount + 1;
    dVar13 = (double)local_104;
    pcVar11 = (char *)local_160;
    std::__cxx11::to_string((__cxx11 *)pcVar11,local_104 + 1);
    local_140._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
         ::find(pmVar2,(key_type *)pcVar11);
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
              ::operator->(&local_140);
    dVar14 = bubbleJson::BubbleValue::GetNumber(&ppVar12->second);
    std::__cxx11::string::~string((string *)local_160);
    pmVar2 = pmStack_100;
    pFVar1 = _stderr;
    if ((dVar13 + 1.0 != dVar14) || (NAN(dVar13 + 1.0) || NAN(dVar14))) {
      dVar13 = (double)local_104;
      std::__cxx11::to_string(local_188,local_104 + 1);
      local_168._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
           ::find(pmVar2,(key_type *)local_188);
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
                ::operator->(&local_168);
      dVar14 = bubbleJson::BubbleValue::GetNumber(&ppVar12->second);
      pcVar11 = "%s:%d: expect: %.17g actual: %.17g\n";
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",dVar13 + 1.0,dVar14,
              "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/test.cpp",
              0x1ec);
      std::__cxx11::string::~string((string *)local_188);
      g_Result = 1;
    }
    else {
      g_TestPass = g_TestPass + 1;
    }
  }
  if (local_20 != (BubbleValue *)0x0) {
    bubbleJson::BubbleValue::~BubbleValue(local_20);
    bubbleJson::BubbleValue::operator_delete(pBVar3,pcVar11);
  }
  return;
}

Assistant:

static void TestParseObject()
{
    tuple<ParseResults, BubbleValue*> result;
    BubbleValue *value;
    result = gm_BubbleJson.Parse("{ }");
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Object, value->GetType());
    EXPECT_EQ_SIZE_T(0, value->GetObjectCount());
    delete value;

    //a good way
    result = gm_BubbleJson.Parse(
            " { "
                    "\"n\" : null , "
                    "\"f\" : false , "
                    "\"t\" : true , "
                    "\"i\" : 123 , "
                    "\"s\" : \"abc\", "
                    "\"a\" : [ 1, 2, 3 ],"
                    "\"o\" : { \"1\" : 1, \"2\" : 2, \"3\" : 3 }"
                    " } "
    );
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Object, value->GetType());
    EXPECT_EQ_SIZE_T(7, value->GetObjectCount());

    EXPECT_TRUE(&(*value)["n"] != nullptr);//kind of weird
    EXPECT_EQ_INT(ValueType_Null, (*value)["n"].GetType());
    EXPECT_TRUE(&(*value)["f"] != nullptr);
    EXPECT_EQ_INT(ValueType_False, (*value)["f"].GetType());
    EXPECT_TRUE(&(*value)["t"] != nullptr);
    EXPECT_EQ_INT(ValueType_True, (*value)["t"].GetType());

    EXPECT_TRUE(&(*value)["i"] != nullptr);
    EXPECT_EQ_INT(ValueType_Number, (*value)["i"].GetType());
    EXPECT_EQ_DOUBLE(123.0, (*value)["i"].GetNumber());

    EXPECT_TRUE(&(*value)["s"] != nullptr);
    EXPECT_EQ_INT(ValueType_String, (*value)["s"].GetType());
    EXPECT_EQ_STRING("abc", (*value)["s"].GetString(), (*value)["s"].GetStringLength());

    EXPECT_TRUE(&(*value)["a"] != nullptr);
    EXPECT_EQ_INT(ValueType_Array, (*value)["a"].GetType());
    EXPECT_EQ_SIZE_T(3, (*value)["a"].GetArrayCount());
    for (int i = 0; i < 3; ++i)
    {
        EXPECT_EQ_INT(ValueType_Number, (*value)["a"][i].GetType());
        EXPECT_EQ_DOUBLE(i + 1.0, (*value)["a"][i].GetNumber());
    }

    EXPECT_TRUE(&(*value)["o"] != nullptr);
    EXPECT_EQ_INT(ValueType_Object, (*value)["o"].GetType());
    EXPECT_EQ_SIZE_T(3, (*value)["o"].GetObjectCount());
    for (int i = 0; i < 3; ++i)
    {
        EXPECT_EQ_INT(ValueType_Number, (*value)["o"][to_string(i+1)].GetType());
        EXPECT_EQ_DOUBLE(i + 1.0, (*value)["o"][to_string(i+1)].GetNumber());
    }
    delete value;


    //another way
    result = gm_BubbleJson.Parse(
            " { "
            "\"n\" : null , "
            "\"f\" : false , "
            "\"t\" : true , "
            "\"i\" : 123 , "
            "\"s\" : \"abc\", "
            "\"a\" : [ 1, 2, 3 ],"
            "\"o\" : { \"1\" : 1, \"2\" : 2, \"3\" : 3 }"
            " } "
    );
    value = get<1>(result);
    EXPECT_EQ_INT(ParseResult_Ok, get<0>(result));
    EXPECT_EQ_INT(ValueType_Object, value->GetType());
    EXPECT_EQ_SIZE_T(7, value->GetObjectCount());

    EXPECT_TRUE(value->GetObjectValueWithKey("n") != nullptr);
    EXPECT_EQ_INT(ValueType_Null, value->GetObjectValueWithKey("n")->GetType());
    EXPECT_TRUE(value->GetObjectValueWithKey("f") != nullptr);
    EXPECT_EQ_INT(ValueType_False, value->GetObjectValueWithKey("f")->GetType());
    EXPECT_TRUE(value->GetObjectValueWithKey("t") != nullptr);
    EXPECT_EQ_INT(ValueType_True, value->GetObjectValueWithKey("t")->GetType());

    EXPECT_TRUE(value->GetObjectValueWithKey("i") != nullptr);
    EXPECT_EQ_INT(ValueType_Number, value->GetObjectValueWithKey("i")->GetType());
    EXPECT_EQ_DOUBLE(123.0, value->GetObjectValueWithKey("i")->GetNumber());

    EXPECT_TRUE(value->GetObjectValueWithKey("s") != nullptr);
    EXPECT_EQ_INT(ValueType_String, value->GetObjectValueWithKey("s")->GetType());
    EXPECT_EQ_STRING("abc", value->GetObjectValueWithKey("s")->GetString(), value->GetObjectValueWithKey("s")->GetStringLength());

    EXPECT_TRUE(value->GetObjectValueWithKey("a") != nullptr);
    EXPECT_EQ_INT(ValueType_Array, value->GetObjectValueWithKey("a")->GetType());
    EXPECT_EQ_SIZE_T(3, value->GetObjectValueWithKey("a")->GetArrayCount());
    for (int i = 0; i < 3; ++i)
    {
        BubbleValue* valueLevel2 = value->GetObjectValueWithKey("a")->GetArrayElement(i);
        EXPECT_EQ_INT(ValueType_Number, valueLevel2->GetType());
        EXPECT_EQ_DOUBLE(i + 1.0, valueLevel2->GetNumber());
    }

    EXPECT_TRUE(value->GetObjectValueWithKey("o") != nullptr);
    EXPECT_EQ_INT(ValueType_Object, value->GetObjectValueWithKey("o")->GetType());
    EXPECT_EQ_SIZE_T(3, value->GetObjectValueWithKey("o")->GetObjectCount());
    auto objects = value->GetObjectValueWithKey("o")->GetObjects();
    for (int i = 0; i < 3; ++i)
    {
        EXPECT_TRUE(objects->find(to_string(i+1)) != objects->end());
        EXPECT_EQ_DOUBLE(i + 1.0, objects->find(to_string(i+1))->second.GetNumber());
    }
    delete value;
}